

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall cmGeneratorTarget::AddHeaderSetVerification(cmGeneratorTarget *this)

{
  cmLocalGenerator **ppcVar1;
  __uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_> _Var2;
  cmMakefile *pcVar3;
  cmFileSet *this_00;
  cmLocalGenerator *this_01;
  pointer pbVar4;
  bool bVar5;
  TargetType TVar6;
  uint uVar7;
  string *psVar8;
  size_type sVar9;
  cmSourceFile *source;
  cmTarget *this_02;
  _Rb_tree_node_base *p_Var10;
  _Base_ptr p_Var11;
  pointer puVar12;
  long lVar13;
  long lVar14;
  pointer puVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  _Var16;
  pointer __x;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *fileCge;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *sourceName;
  undefined1 uVar17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  string_view separator;
  cmBTStringRange cVar18;
  allocator<char> local_246;
  undefined1 local_245;
  uint local_244;
  PolicyPushPop polScope;
  cmTarget *verifyTarget;
  uint local_22c;
  string *local_228;
  cmFileSet *local_220;
  cmTarget *local_218;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_210;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_208;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> local_200;
  cmList verifyList;
  optional<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  languages;
  cmBTStringRange local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  cmGeneratorTarget *local_160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  filesPerDir;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  dirCges;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  fileCges;
  string filename;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  verifySet;
  set<cmFileSet_*,_std::less<cmFileSet_*>,_std::allocator<cmFileSet_*>_> fileSets;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&languages,"VERIFY_INTERFACE_HEADER_SETS",(allocator<char> *)&verifyList);
  bVar5 = GetPropertyAsBool(this,(string *)&languages);
  std::__cxx11::string::~string((string *)&languages);
  uVar17 = 1;
  if ((bVar5) &&
     (((((TVar6 = GetType(this), TVar6 == STATIC_LIBRARY ||
         (TVar6 = GetType(this), TVar6 == SHARED_LIBRARY)) ||
        (TVar6 = GetType(this), TVar6 == UNKNOWN_LIBRARY)) ||
       ((TVar6 = GetType(this), TVar6 == OBJECT_LIBRARY ||
        (TVar6 = GetType(this), TVar6 == INTERFACE_LIBRARY)))) ||
      (bVar5 = IsExecutableWithExports(this), bVar5)))) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&languages,"INTERFACE_HEADER_SETS_TO_VERIFY",(allocator<char> *)&verifyList
              );
    psVar8 = (string *)GetProperty(this,(string *)&languages);
    std::__cxx11::string::~string((string *)&languages);
    if (psVar8 == (string *)0x0) {
      bVar5 = true;
    }
    else {
      bVar5 = psVar8->_M_string_length == 0;
    }
    verifySet._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &verifySet._M_t._M_impl.super__Rb_tree_header._M_header;
    verifySet._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    verifySet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    verifySet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    verifySet._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         verifySet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (!bVar5) {
      if (psVar8 == (string *)0x0) {
        psVar8 = &cmValue::Empty_abi_cxx11_;
      }
      std::__cxx11::string::string((string *)&languages,(string *)psVar8);
      init._M_len = 1;
      init._M_array = (iterator)&languages;
      cmList::cmList(&verifyList,init);
      std::__cxx11::string::~string((string *)&languages);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::
      _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&verifySet,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )verifyList.Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )verifyList.Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&verifyList.Values);
    }
    verifyTarget = (cmTarget *)0x0;
    _Var2._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
    super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
         (((this->GlobalGenerator->Makefiles).
           super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&languages,"all_verify_interface_header_sets",
               (allocator<char> *)&verifyList);
    local_218 = cmMakefile::FindTargetToUse
                          ((cmMakefile *)
                           _Var2._M_t.
                           super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,
                           (string *)&languages,true);
    std::__cxx11::string::~string((string *)&languages);
    cVar18 = cmTarget::GetInterfaceHeaderSetsEntries_abi_cxx11_(this->Target);
    fileSets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fileSets._M_t._M_impl.super__Rb_tree_header._M_header;
    fileSets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fileSets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fileSets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    fileSets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fileSets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      local_210 = cVar18.End._M_current;
      _Var16 = cVar18.Begin._M_current;
      if (_Var16._M_current == local_210._M_current) break;
      std::__cxx11::string::string((string *)&languages,(string *)_Var16._M_current);
      init_00._M_len = 1;
      init_00._M_array = (iterator)&languages;
      local_208 = _Var16._M_current;
      cmList::cmList(&verifyList,init_00);
      std::__cxx11::string::~string((string *)&languages);
      pbVar4 = verifyList.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__x = verifyList.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; __x != pbVar4; __x = __x + 1) {
        if ((bVar5) ||
           (sVar9 = std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&verifySet._M_t,__x), sVar9 != 0)) {
          languages.
          super__Optional_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_payload._0_8_ = cmTarget::GetFileSet(this->Target,__x);
          std::
          _Rb_tree<cmFileSet*,cmFileSet*,std::_Identity<cmFileSet*>,std::less<cmFileSet*>,std::allocator<cmFileSet*>>
          ::_M_insert_unique<cmFileSet*>
                    ((_Rb_tree<cmFileSet*,cmFileSet*,std::_Identity<cmFileSet*>,std::less<cmFileSet*>,std::allocator<cmFileSet*>>
                      *)&fileSets,(cmFileSet **)&languages);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::erase(&verifySet._M_t,__x);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&verifyList.Values);
      cVar18.End._M_current = local_210._M_current;
      cVar18.Begin._M_current = local_208 + 1;
    }
    uVar17 = verifySet._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
    if ((bool)uVar17) {
      languages.
      super__Optional_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_engaged = false;
      ppcVar1 = &this->LocalGenerator;
      p_Var11 = fileSets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_245 = uVar17;
      local_160 = this;
      while( true ) {
        uVar17 = local_245;
        if ((_Rb_tree_header *)p_Var11 == &fileSets._M_t._M_impl.super__Rb_tree_header) break;
        this_00 = *(cmFileSet **)(p_Var11 + 1);
        cmFileSet::CompileDirectoryEntries(&dirCges,this_00);
        local_220 = this_00;
        cmFileSet::CompileFileEntries(&fileCges,this_00);
        dirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        filesPerDir._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        filesPerDir._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        dirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        dirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        filesPerDir._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &filesPerDir._M_t._M_impl.super__Rb_tree_header._M_header;
        filesPerDir._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        filesPerDir._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             filesPerDir._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        cmMakefile::GetGeneratorConfigs_abi_cxx11_(&local_e0,this->Makefile,IncludeEmptyConfig);
        pbVar4 = local_e0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar5 = true;
        local_244 = 0;
        psVar8 = local_e0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar7 = 0;
        do {
          if (psVar8 == pbVar4) break;
          local_228 = psVar8;
          if ((bVar5) || ((uVar7 & 1) != 0)) {
            cmFileSet::EvaluateDirectoryEntries
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&verifyList,local_220,&dirCges,this->LocalGenerator,psVar8,this,
                       (cmGeneratorExpressionDAGChecker *)0x0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_move_assign(&dirs,(_Optional_payload_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>_>
                                    *)&verifyList);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&verifyList);
            lVar13 = (long)dirCges.
                           super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)dirCges.
                           super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            puVar12 = dirCges.
                      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            for (lVar14 = lVar13 >> 5; 0 < lVar14; lVar14 = lVar14 + -1) {
              puVar15 = puVar12;
              if (((puVar12->_M_t).
                   super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                   .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                  HadContextSensitiveCondition != false) goto LAB_00385eec;
              if ((puVar12[1]._M_t.
                   super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                   .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                  HadContextSensitiveCondition != false) {
                puVar15 = puVar12 + 1;
                goto LAB_00385eec;
              }
              if ((puVar12[2]._M_t.
                   super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                   .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                  HadContextSensitiveCondition != false) {
                puVar15 = puVar12 + 2;
                goto LAB_00385eec;
              }
              if ((puVar12[3]._M_t.
                   super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                   .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                  HadContextSensitiveCondition != false) {
                puVar15 = puVar12 + 3;
                goto LAB_00385eec;
              }
              puVar12 = puVar12 + 4;
              lVar13 = lVar13 + -0x20;
            }
            lVar13 = lVar13 >> 3;
            if (lVar13 == 1) {
LAB_00385ec9:
              puVar15 = puVar12;
              if (((puVar12->_M_t).
                   super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                   .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                  HadContextSensitiveCondition == false) {
                puVar15 = dirCges.
                          super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              }
            }
            else if (lVar13 == 2) {
LAB_00385eb9:
              puVar15 = puVar12;
              if (((puVar12->_M_t).
                   super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                   .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                  HadContextSensitiveCondition == false) {
                puVar12 = puVar12 + 1;
                goto LAB_00385ec9;
              }
            }
            else {
              puVar15 = dirCges.
                        super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              if ((lVar13 == 3) &&
                 (puVar15 = puVar12,
                 ((puVar12->_M_t).
                  super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                  .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                 HadContextSensitiveCondition == false)) {
                puVar12 = puVar12 + 1;
                goto LAB_00385eb9;
              }
            }
LAB_00385eec:
            uVar7 = (uint)CONCAT71((int7)((ulong)dirCges.
                                                 super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish >> 8),
                                   puVar15 !=
                                   dirCges.
                                   super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
            if (!bVar5) goto LAB_00385ef8;
LAB_00385eff:
            local_22c = uVar7;
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::clear(&filesPerDir._M_t);
            puVar12 = fileCges.
                      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (puVar15 = fileCges.
                           super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                p_Var10 = filesPerDir._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                psVar8 = local_228, puVar15 != puVar12; puVar15 = puVar15 + 1) {
              cmFileSet::EvaluateFileEntry
                        (local_220,&dirs,&filesPerDir,puVar15,this->LocalGenerator,local_228,this,
                         (cmGeneratorExpressionDAGChecker *)0x0);
              local_244 = local_244 & 0xff;
              if (((puVar15->_M_t).
                   super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                   .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                  HadContextSensitiveCondition != false) {
                local_244 = 1;
              }
            }
          }
          else {
LAB_00385ef8:
            p_Var10 = filesPerDir._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            local_22c = uVar7;
            if ((local_244 & 1) != 0) goto LAB_00385eff;
          }
          for (; (_Rb_tree_header *)p_Var10 != &filesPerDir._M_t._M_impl.super__Rb_tree_header;
              p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
            local_210._M_current =
                 (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(p_Var10 + 1);
            local_208 = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)p_Var10[2]._M_parent;
            for (sourceName = *(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                **)(p_Var10 + 2); sourceName != local_208;
                sourceName = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&sourceName->Backtrace) {
              source = cmMakefile::GetOrCreateSource
                                 (this->Makefile,&sourceName->Value,false,Ambiguous);
              GenerateHeaderSetVerificationFile
                        (&filename,this,source,&(local_210._M_current)->Value,&languages);
              if (filename._M_string_length != 0) {
                if (verifyTarget == (cmTarget *)0x0) {
                  cmMakefile::PolicyPushPop::PolicyPushPop(&polScope,this->Makefile);
                  cmMakefile::SetPolicy(this->Makefile,CMP0119,NEW);
                  pcVar3 = this->Makefile;
                  psVar8 = GetName_abi_cxx11_(this);
                  cmStrCat<std::__cxx11::string_const&,char_const(&)[30]>
                            ((string *)&verifyList,psVar8,(char (*) [30])0x6ae415);
                  local_188 = (cmBTStringRange)ZEXT816(0);
                  local_178._M_allocated_capacity = 0;
                  this_02 = cmMakefile::AddLibrary
                                      (pcVar3,(string *)&verifyList,OBJECT_LIBRARY,
                                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)&local_188,true);
                  verifyTarget = this_02;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_188);
                  std::__cxx11::string::~string((string *)&verifyList);
                  cmMakefile::PolicyPushPop::~PolicyPushPop(&polScope);
                  this = local_160;
                  pcVar3 = local_160->Makefile;
                  psVar8 = GetName_abi_cxx11_(local_160);
                  cmTarget::AddLinkLibrary(this_02,pcVar3,psVar8,GENERAL_LibraryType);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&verifyList,"AUTOMOC",(allocator<char> *)&polScope);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_188,"OFF",&local_246);
                  cmTarget::SetProperty(this_02,(string *)&verifyList,(string *)&local_188);
                  std::__cxx11::string::~string((string *)&local_188);
                  std::__cxx11::string::~string((string *)&verifyList);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&verifyList,"AUTORCC",(allocator<char> *)&polScope);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_188,"OFF",&local_246);
                  cmTarget::SetProperty(this_02,(string *)&verifyList,(string *)&local_188);
                  std::__cxx11::string::~string((string *)&local_188);
                  std::__cxx11::string::~string((string *)&verifyList);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&verifyList,"AUTOUIC",(allocator<char> *)&polScope);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_188,"OFF",&local_246);
                  cmTarget::SetProperty(this_02,(string *)&verifyList,(string *)&local_188);
                  std::__cxx11::string::~string((string *)&local_188);
                  std::__cxx11::string::~string((string *)&verifyList);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&verifyList,"DISABLE_PRECOMPILE_HEADERS",
                             (allocator<char> *)&polScope);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_188,"ON",&local_246);
                  cmTarget::SetProperty(this_02,(string *)&verifyList,(string *)&local_188);
                  std::__cxx11::string::~string((string *)&local_188);
                  std::__cxx11::string::~string((string *)&verifyList);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&verifyList,"UNITY_BUILD",(allocator<char> *)&polScope);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_188,"OFF",&local_246);
                  cmTarget::SetProperty(this_02,(string *)&verifyList,(string *)&local_188);
                  std::__cxx11::string::~string((string *)&local_188);
                  std::__cxx11::string::~string((string *)&verifyList);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&verifyList,"CXX_SCAN_FOR_MODULES",
                             (allocator<char> *)&polScope);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_188,"OFF",&local_246);
                  cmTarget::SetProperty(this_02,(string *)&verifyList,(string *)&local_188);
                  std::__cxx11::string::~string((string *)&local_188);
                  std::__cxx11::string::~string((string *)&verifyList);
                  local_188 = cmMakefile::GetCompileDefinitionsEntries_abi_cxx11_(this->Makefile);
                  cmTarget::FinalizeTargetConfiguration
                            (this_02,&local_188,
                             (optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>_>
                              *)&verifyList);
                  if (local_218 == (cmTarget *)0x0) {
                    _Var2._M_t.
                    super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                    super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
                         (((this->GlobalGenerator->Makefiles).
                           super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                         super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_188,"all_verify_interface_header_sets",
                               (allocator<char> *)&polScope);
                    local_218 = cmMakefile::AddNewUtilityTarget
                                          ((cmMakefile *)
                                           _Var2._M_t.
                                           super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>
                                           .super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,
                                           (string *)&local_188,true);
                    std::__cxx11::string::~string((string *)&local_188);
                    this = local_160;
                  }
                  psVar8 = cmTarget::GetName_abi_cxx11_(this_02);
                  cmTarget::AddUtility(local_218,psVar8,false,(cmMakefile *)0x0);
                  std::
                  _Optional_payload_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>_>
                  ::_M_reset((_Optional_payload_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>_>
                              *)&verifyList);
                }
                if ((local_244 & 1) != 0) {
                  cmStrCat<char_const(&)[12],std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
                            ((string *)&verifyList,(char (*) [12])0x69ed89,local_228,
                             (char (*) [3])">:",&filename,(char (*) [2])0x6ba9d1);
                  std::__cxx11::string::operator=((string *)&filename,(string *)&verifyList);
                  std::__cxx11::string::~string((string *)&verifyList);
                }
                cmTarget::AddSource(verifyTarget,&filename,false);
              }
              std::__cxx11::string::~string((string *)&filename);
            }
            psVar8 = local_228;
          }
          psVar8 = psVar8 + 1;
          bVar5 = false;
          uVar7 = local_22c;
        } while (((local_22c & 1) != 0) || ((local_244 & 1) != 0));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_e0);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~_Rb_tree(&filesPerDir._M_t);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&dirs);
        std::
        vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
        ::~vector(&fileCges);
        std::
        vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
        ::~vector(&dirCges);
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
      }
      if (verifyTarget != (cmTarget *)0x0) {
        this_01 = *ppcVar1;
        std::make_unique<cmGeneratorTarget,cmTarget*&,cmLocalGenerator*&>
                  ((cmTarget **)&local_200,(cmLocalGenerator **)&verifyTarget);
        cmLocalGenerator::AddGeneratorTarget(this_01,&local_200);
        std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
                  (&local_200);
      }
      std::
      _Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_reset((_Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&languages);
    }
    else {
      pcVar3 = this->Makefile;
      psVar8 = GetName_abi_cxx11_(this);
      separator._M_str = "\n  ";
      separator._M_len = 3;
      cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                ((string *)&verifyList,&verifySet,separator);
      cmStrCat<char_const(&)[53],std::__cxx11::string_const&,char_const(&)[80],std::__cxx11::string>
                ((string *)&languages,
                 (char (*) [53])"Property INTERFACE_HEADER_SETS_TO_VERIFY of target \"",psVar8,
                 (char (*) [80])
                 "\" contained the following header sets that are nonexistent or not INTERFACE:\n  "
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&verifyList);
      cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,(string *)&languages);
      std::__cxx11::string::~string((string *)&languages);
      std::__cxx11::string::~string((string *)&verifyList);
    }
    std::
    _Rb_tree<cmFileSet_*,_cmFileSet_*,_std::_Identity<cmFileSet_*>,_std::less<cmFileSet_*>,_std::allocator<cmFileSet_*>_>
    ::~_Rb_tree(&fileSets._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&verifySet._M_t);
  }
  return (bool)uVar17;
}

Assistant:

bool cmGeneratorTarget::AddHeaderSetVerification()
{
  if (!this->GetPropertyAsBool("VERIFY_INTERFACE_HEADER_SETS")) {
    return true;
  }

  if (this->GetType() != cmStateEnums::STATIC_LIBRARY &&
      this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::UNKNOWN_LIBRARY &&
      this->GetType() != cmStateEnums::OBJECT_LIBRARY &&
      this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      !this->IsExecutableWithExports()) {
    return true;
  }

  auto verifyValue = this->GetProperty("INTERFACE_HEADER_SETS_TO_VERIFY");
  const bool all = verifyValue.IsEmpty();
  std::set<std::string> verifySet;
  if (!all) {
    cmList verifyList{ verifyValue };
    verifySet.insert(verifyList.begin(), verifyList.end());
  }

  cmTarget* verifyTarget = nullptr;
  cmTarget* allVerifyTarget =
    this->GlobalGenerator->GetMakefiles().front()->FindTargetToUse(
      "all_verify_interface_header_sets", true);

  auto interfaceFileSetEntries = this->Target->GetInterfaceHeaderSetsEntries();

  std::set<cmFileSet*> fileSets;
  for (auto const& entry : interfaceFileSetEntries) {
    for (auto const& name : cmList{ entry.Value }) {
      if (all || verifySet.count(name)) {
        fileSets.insert(this->Target->GetFileSet(name));
        verifySet.erase(name);
      }
    }
  }
  if (!verifySet.empty()) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Property INTERFACE_HEADER_SETS_TO_VERIFY of target \"",
               this->GetName(),
               "\" contained the following header sets that are nonexistent "
               "or not INTERFACE:\n  ",
               cmJoin(verifySet, "\n  ")));
    return false;
  }

  cm::optional<std::set<std::string>> languages;
  for (auto* fileSet : fileSets) {
    auto dirCges = fileSet->CompileDirectoryEntries();
    auto fileCges = fileSet->CompileFileEntries();

    static auto const contextSensitive =
      [](const std::unique_ptr<cmCompiledGeneratorExpression>& cge) {
        return cge->GetHadContextSensitiveCondition();
      };
    bool dirCgesContextSensitive = false;
    bool fileCgesContextSensitive = false;

    std::vector<std::string> dirs;
    std::map<std::string, std::vector<std::string>> filesPerDir;
    bool first = true;
    for (auto const& config : this->Makefile->GetGeneratorConfigs(
           cmMakefile::GeneratorConfigQuery::IncludeEmptyConfig)) {
      if (first || dirCgesContextSensitive) {
        dirs = fileSet->EvaluateDirectoryEntries(dirCges, this->LocalGenerator,
                                                 config, this);
        dirCgesContextSensitive =
          std::any_of(dirCges.begin(), dirCges.end(), contextSensitive);
      }
      if (first || fileCgesContextSensitive) {
        filesPerDir.clear();
        for (auto const& fileCge : fileCges) {
          fileSet->EvaluateFileEntry(dirs, filesPerDir, fileCge,
                                     this->LocalGenerator, config, this);
          if (fileCge->GetHadContextSensitiveCondition()) {
            fileCgesContextSensitive = true;
          }
        }
      }

      for (auto const& files : filesPerDir) {
        for (auto const& file : files.second) {
          std::string filename = this->GenerateHeaderSetVerificationFile(
            *this->Makefile->GetOrCreateSource(file), files.first, languages);
          if (filename.empty()) {
            continue;
          }

          if (!verifyTarget) {
            {
              cmMakefile::PolicyPushPop polScope(this->Makefile);
              this->Makefile->SetPolicy(cmPolicies::CMP0119, cmPolicies::NEW);
              verifyTarget = this->Makefile->AddLibrary(
                cmStrCat(this->GetName(), "_verify_interface_header_sets"),
                cmStateEnums::OBJECT_LIBRARY, {}, true);
            }

            verifyTarget->AddLinkLibrary(
              *this->Makefile, this->GetName(),
              cmTargetLinkLibraryType::GENERAL_LibraryType);
            verifyTarget->SetProperty("AUTOMOC", "OFF");
            verifyTarget->SetProperty("AUTORCC", "OFF");
            verifyTarget->SetProperty("AUTOUIC", "OFF");
            verifyTarget->SetProperty("DISABLE_PRECOMPILE_HEADERS", "ON");
            verifyTarget->SetProperty("UNITY_BUILD", "OFF");
            verifyTarget->SetProperty("CXX_SCAN_FOR_MODULES", "OFF");
            cm::optional<std::map<std::string, cmValue>>
              perConfigCompileDefinitions;
            verifyTarget->FinalizeTargetConfiguration(
              this->Makefile->GetCompileDefinitionsEntries(),
              perConfigCompileDefinitions);

            if (!allVerifyTarget) {
              allVerifyTarget = this->GlobalGenerator->GetMakefiles()
                                  .front()
                                  ->AddNewUtilityTarget(
                                    "all_verify_interface_header_sets", true);
            }

            allVerifyTarget->AddUtility(verifyTarget->GetName(), false);
          }

          if (fileCgesContextSensitive) {
            filename = cmStrCat("$<$<CONFIG:", config, ">:", filename, ">");
          }
          verifyTarget->AddSource(filename);
        }
      }

      if (!dirCgesContextSensitive && !fileCgesContextSensitive) {
        break;
      }
      first = false;
    }
  }

  if (verifyTarget) {
    this->LocalGenerator->AddGeneratorTarget(
      cm::make_unique<cmGeneratorTarget>(verifyTarget, this->LocalGenerator));
  }

  return true;
}